

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O2

CTypeID cp_decl_struct(CPState *cp,CPDecl *sdecl,CTInfo sinfo)

{
  CTypeID CVar1;
  int iVar2;
  CPscl CVar3;
  CTypeID CVar4;
  CTypeID CVar5;
  CTInfo CVar6;
  ulong uVar7;
  uint uVar8;
  CTSize CVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  CType *pCVar13;
  uint uVar14;
  CType *pCVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  CTypeID CVar20;
  bool bVar21;
  CType *ct;
  uint local_9dc;
  CType *local_9d8;
  CPDecl decl;
  
  CVar1 = cp_struct_name(cp,sdecl,sinfo);
  iVar2 = cp_opt(cp,0x7b);
  if (iVar2 == 0) {
    return CVar1;
  }
  bVar21 = false;
  CVar20 = CVar1;
LAB_00142e0a:
  if (cp->tok == 0x7d) {
    cp_check(cp,0x7d);
    cp->cts->tab[CVar20].sib = 0;
    cp_decl_attributes(cp,sdecl);
    local_9dc = sdecl->attr;
    uVar16 = local_9dc >> 0x10 & 0xf;
    pCVar13 = cp->cts->tab;
    pCVar15 = pCVar13 + CVar1;
    uVar8 = 0;
    uVar19 = 0;
    uVar17 = pCVar13[CVar1].info;
    local_9d8 = pCVar15;
    do {
      do {
        uVar7 = (ulong)pCVar15->sib;
        if (uVar7 == 0) {
          local_9d8->info = uVar16 * 0x10000 + uVar17;
          if ((uVar17 >> 0x17 & 1) == 0) {
            uVar8 = uVar19;
          }
          iVar2 = 8 << ((byte)uVar16 & 0x1f);
          local_9d8->size = (-iVar2 & (iVar2 + uVar8) - 1) >> 3;
          return CVar1;
        }
        pCVar13 = cp->cts->tab;
        pCVar15 = pCVar13 + uVar7;
        uVar12 = pCVar13[uVar7].info;
        uVar14 = pCVar13[uVar7].size;
      } while (((uVar12 & 0xf0000000) != 0x90000000) &&
              (uVar14 == 0 || (uVar12 & 0xf0ff0000) != 0x80030000));
      CVar6 = lj_ctype_info(cp->cts,uVar12 & 0xffff,&decl.top);
      if ((0x1fffffff < decl.top) ||
         ((uVar12 = decl.top * 8, ~uVar19 < uVar12 || ((CVar6 & 0x100000) != 0)))) {
        if ((decl.top != 0xffffffff) ||
           (((CVar6 & 0xf0000000) != 0x30000000 || ((uVar17 & 0x800000) != 0)))) {
          cp_err(cp,LJ_ERR_FFI_INVSIZE);
        }
        decl.top = 0;
        uVar12 = 0;
      }
      if (((uVar14 | local_9dc) & 2) == 0) {
        uVar18 = CVar6 >> 0x10 & 0xf;
        if (((uVar14 & 1) != 0) && (uVar10 = uVar14 >> 0x10 & 0xf, uVar18 < uVar10)) {
          uVar18 = uVar10;
        }
      }
      else {
        uVar18 = uVar14 >> 0x10 & 0xf;
      }
      uVar10 = (uint)cp->packstack[cp->curpack];
      if (uVar18 < cp->packstack[cp->curpack]) {
        uVar10 = uVar18;
      }
      if (uVar16 < uVar10) {
        uVar16 = uVar10;
      }
      iVar2 = 8 << ((byte)uVar10 & 0x1f);
      uVar18 = iVar2 - 1;
      uVar10 = pCVar15->info;
      uVar11 = uVar10 >> 0x10 & 0x7f;
      if ((uVar10 & 0xf0000000) == 0x90000000 && uVar11 != 0x7f) {
        if (((uVar14 & 1) != 0 || uVar11 == 0) ||
           ((((uVar14 | local_9dc) & 2) == 0 && (uVar12 < (uVar18 & uVar19) + uVar11)))) {
          uVar19 = -iVar2 & uVar19 + uVar18;
        }
        if ((uVar11 == uVar12) && ((uVar18 & uVar19) == 0)) {
          pCVar15->info = uVar10 & 0x9000ffff;
          uVar14 = uVar19;
        }
        else {
          pCVar15->info =
               uVar11 * 0x100 + uVar12 * 0x2000 + (CVar6 & 0xb800000) + (uVar12 - 1 & uVar19) +
               0xa0000000;
          uVar14 = -uVar12;
          uVar12 = uVar11;
          uVar14 = uVar14 & uVar19;
        }
      }
      else {
        uVar19 = -iVar2 & uVar18 + uVar19;
        uVar14 = uVar19;
      }
      uVar18 = uVar8;
      if (uVar8 < uVar12) {
        uVar18 = uVar12;
      }
      pCVar15->size = uVar14 >> 3;
      if ((uVar17 >> 0x17 & 1) != 0) {
        uVar12 = 0;
        uVar8 = uVar18;
      }
      uVar19 = uVar19 + uVar12;
      uVar17 = CVar6 & 0x3100000 | uVar17;
    } while( true );
  }
  CVar3 = cp_decl_spec(cp,&decl,0x20000);
  decl.mode = 4;
  if (CVar3 == 0) {
    decl.mode = 0xe;
  }
  do {
    if (bVar21) {
      cp_err_token(cp,0x7d);
    }
    decl.bits = 0xffffffff;
    cp_declarator(cp,&decl);
    CVar4 = cp_decl_intern(cp,&decl);
    if ((CVar3 >> 0x11 & 1) == 0) {
      CVar5 = lj_ctype_new(cp->cts,&ct);
      pCVar15 = cp->cts->tab;
      uVar16 = pCVar15[CVar4].info;
      pCVar13 = pCVar15 + CVar4;
      if (decl.bits == 0xffffffff) {
        bVar21 = false;
        if ((uVar16 & 0xf0000000) == 0x30000000) {
          bVar21 = pCVar13->size == 0xffffffff;
        }
        if (decl.name != (GCstr *)0x0) {
          CVar9 = 0x7f;
          goto LAB_00142f61;
        }
        if ((uVar16 & 0xf0000000) != 0x50000000 && (uVar16 & 0xf0100000) != 0x10000000) {
          cp_err_token(cp,0x100);
        }
        ct->info = CVar4 + 0x80030000;
        uVar16 = decl.attr | 0x80000000;
        if ((pCVar13->info & 0xf0000000) != 0x10000000) {
          uVar16 = 0;
        }
        ct->size = uVar16;
      }
      else {
        if ((((uVar16 & 0xf4000000) != 0) || (decl.bits == 0 && decl.name != (GCstr *)0x0)) ||
           (uVar8 = pCVar13->size << 3, 0x20 < uVar8)) {
LAB_001432c8:
          cp_errmsg(cp,0x3a,LJ_ERR_BADVAL);
        }
        if (0x7ffffff < uVar16) {
          uVar8 = 1;
        }
        if (uVar8 < decl.bits) goto LAB_001432c8;
        bVar21 = false;
        CVar9 = decl.bits;
LAB_00142f61:
        ct->info = CVar9 * 0x10000 + CVar4 + 0x90000000;
        ct->size = decl.attr;
        if (decl.name != (GCstr *)0x0) {
          (decl.name)->marked = (decl.name)->marked | 0x20;
          (ct->name).gcptr64 = (uint64_t)decl.name;
        }
      }
      pCVar15[CVar20].sib = (CTypeID1)CVar5;
      CVar20 = CVar5;
    }
    else {
      CVar4 = cp_decl_constinit(cp,&ct,CVar4);
      cp->cts->tab[CVar20].sib = (CTypeID1)CVar4;
      (decl.name)->marked = (decl.name)->marked | 0x20;
      (ct->name).gcptr64 = (uint64_t)decl.name;
      bVar21 = false;
      CVar20 = CVar4;
    }
    iVar2 = cp_opt(cp,0x2c);
    if (iVar2 == 0) break;
    cp_decl_reset(&decl);
  } while( true );
  cp_check(cp,0x3b);
  goto LAB_00142e0a;
}

Assistant:

static CTypeID cp_decl_struct(CPState *cp, CPDecl *sdecl, CTInfo sinfo)
{
  CTypeID sid = cp_struct_name(cp, sdecl, sinfo);
  if (cp_opt(cp, '{')) {  /* Struct/union definition. */
    CTypeID lastid = sid;
    int lastdecl = 0;
    while (cp->tok != '}') {
      CPDecl decl;
      CPscl scl = cp_decl_spec(cp, &decl, CDF_STATIC);
      decl.mode = scl ? CPARSE_MODE_DIRECT :
	CPARSE_MODE_DIRECT|CPARSE_MODE_ABSTRACT|CPARSE_MODE_FIELD;

      for (;;) {
	CTypeID ctypeid;

	if (lastdecl) cp_err_token(cp, '}');

	/* Parse field declarator. */
	decl.bits = CTSIZE_INVALID;
	cp_declarator(cp, &decl);
	ctypeid = cp_decl_intern(cp, &decl);

	if ((scl & CDF_STATIC)) {  /* Static constant in struct namespace. */
	  CType *ct;
	  CTypeID fieldid = cp_decl_constinit(cp, &ct, ctypeid);
	  ctype_get(cp->cts, lastid)->sib = fieldid;
	  lastid = fieldid;
	  ctype_setname(ct, decl.name);
	} else {
	  CTSize bsz = CTBSZ_FIELD;  /* Temp. for layout phase. */
	  CType *ct;
	  CTypeID fieldid = lj_ctype_new(cp->cts, &ct);  /* Do this first. */
	  CType *tct = ctype_raw(cp->cts, ctypeid);

	  if (decl.bits == CTSIZE_INVALID) {  /* Regular field. */
	    if (ctype_isarray(tct->info) && tct->size == CTSIZE_INVALID)
	      lastdecl = 1;  /* a[] or a[?] must be the last declared field. */

	    /* Accept transparent struct/union/enum. */
	    if (!decl.name) {
	      if (!((ctype_isstruct(tct->info) && !(tct->info & CTF_VLA)) ||
		    ctype_isenum(tct->info)))
		cp_err_token(cp, CTOK_IDENT);
	      ct->info = CTINFO(CT_ATTRIB, CTATTRIB(CTA_SUBTYPE) + ctypeid);
	      ct->size = ctype_isstruct(tct->info) ?
			 (decl.attr|0x80000000u) : 0;  /* For layout phase. */
	      goto add_field;
	    }
	  } else {  /* Bitfield. */
	    bsz = decl.bits;
	    if (!ctype_isinteger_or_bool(tct->info) ||
		(bsz == 0 && decl.name) || 8*tct->size > CTBSZ_MAX ||
		bsz > ((tct->info & CTF_BOOL) ? 1 : 8*tct->size))
	      cp_errmsg(cp, ':', LJ_ERR_BADVAL);
	  }

	  /* Create temporary field for layout phase. */
	  ct->info = CTINFO(CT_FIELD, ctypeid + (bsz << CTSHIFT_BITCSZ));
	  ct->size = decl.attr;
	  if (decl.name) ctype_setname(ct, decl.name);

	add_field:
	  ctype_get(cp->cts, lastid)->sib = fieldid;
	  lastid = fieldid;
	}
	if (!cp_opt(cp, ',')) break;
	cp_decl_reset(&decl);
      }
      cp_check(cp, ';');
    }
    cp_check(cp, '}');
    ctype_get(cp->cts, lastid)->sib = 0;  /* Drop sib = 1 for empty structs. */
    cp_decl_attributes(cp, sdecl);  /* Layout phase needs postfix attributes. */
    cp_struct_layout(cp, sid, sdecl->attr);
  }
  return sid;
}